

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::SolverParameter::Clear(SolverParameter *this)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string **ppsVar4;
  LogMessage *pLVar5;
  LogFinisher local_2ca;
  byte local_2c9;
  LogMessage local_2c8;
  LogFinisher local_28a;
  byte local_289;
  LogMessage local_288;
  LogFinisher local_24a;
  byte local_249;
  LogMessage local_248;
  LogFinisher local_20a;
  byte local_209;
  LogMessage local_208;
  LogFinisher local_1ca;
  byte local_1c9;
  LogMessage local_1c8;
  LogFinisher local_18a;
  byte local_189;
  LogMessage local_188;
  LogFinisher local_14a;
  byte local_149;
  LogMessage local_148;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  LogFinisher local_cd [20];
  byte local_b9;
  LogMessage local_b8;
  SolverParameter *local_80;
  SolverParameter *this_local;
  InternalMetadataWithArena *local_70;
  undefined4 local_64;
  HasBits<2UL> *local_60;
  undefined4 local_54;
  HasBits<2UL> *local_50;
  undefined4 local_44;
  HasBits<2UL> *local_40;
  undefined4 local_34;
  HasBits<2UL> *local_30;
  undefined4 local_24;
  HasBits<2UL> *local_20;
  HasBits<2UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_80 = this;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->test_net_);
  google::protobuf::RepeatedField<int>::Clear(&this->test_iter_);
  google::protobuf::RepeatedPtrField<caffe::NetParameter>::Clear(&this->test_net_param_);
  google::protobuf::RepeatedPtrField<caffe::NetState>::Clear(&this->test_state_);
  google::protobuf::RepeatedField<int>::Clear(&this->stepvalue_);
  local_20 = &this->_has_bits_;
  local_24 = 0;
  if ((local_20->has_bits_[0] & 0xff) != 0) {
    bVar1 = has_train_net(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->train_net_,psVar2);
      local_b9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b83);
        local_b9 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_b8,
                            "CHECK failed: !train_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_cd,pLVar5);
      }
      if ((local_b9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_b8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->train_net_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_lr_policy(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->lr_policy_,psVar2);
      local_109 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_108,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b87);
        local_109 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_108,
                            "CHECK failed: !lr_policy_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_10a,pLVar5);
      }
      if ((local_109 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_108);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->lr_policy_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_snapshot_prefix(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->snapshot_prefix_,psVar2);
      local_149 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b8b);
        local_149 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_148,
                            "CHECK failed: !snapshot_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_14a,pLVar5);
      }
      if ((local_149 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_148);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->snapshot_prefix_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_net(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->net_,psVar2);
      local_189 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_188,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b8f);
        local_189 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_188,
                            "CHECK failed: !net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_18a,pLVar5);
      }
      if ((local_189 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_188);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->net_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_regularization_type(this);
    if (bVar1) {
      pbVar3 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)_default_regularization_type__abi_cxx11_);
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault
                        (&this->regularization_type_,pbVar3);
      local_1c9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_1c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b93);
        local_1c9 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_1c8,
                            "CHECK failed: !regularization_type_.IsDefault(&SolverParameter::_default_regularization_type_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_1ca,pLVar5);
      }
      if ((local_1c9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_1c8);
      }
      ppsVar4 = google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                          (&this->regularization_type_);
      psVar2 = *ppsVar4;
      google::protobuf::internal::
      ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)_default_regularization_type__abi_cxx11_);
      std::__cxx11::string::assign((string *)psVar2);
    }
    bVar1 = has_type(this);
    if (bVar1) {
      pbVar3 = google::protobuf::internal::
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)_default_type__abi_cxx11_);
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->type_,pbVar3);
      local_209 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_208,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b97);
        local_209 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_208,
                            "CHECK failed: !type_.IsDefault(&SolverParameter::_default_type_.get()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_20a,pLVar5);
      }
      if ((local_209 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_208);
      }
      ppsVar4 = google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                          (&this->type_);
      psVar2 = *ppsVar4;
      google::protobuf::internal::
      ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)_default_type__abi_cxx11_);
      std::__cxx11::string::assign((string *)psVar2);
    }
    bVar1 = has_train_net_param(this);
    if (bVar1) {
      local_249 = 0;
      if (this->train_net_param_ == (NetParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_248,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b9b);
        local_249 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_248,"CHECK failed: train_net_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_24a,pLVar5);
      }
      if ((local_249 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_248);
      }
      NetParameter::Clear(this->train_net_param_);
    }
    bVar1 = has_net_param(this);
    if (bVar1) {
      local_289 = 0;
      if (this->net_param_ == (NetParameter *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_288,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1b9f);
        local_289 = 1;
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           (&local_288,"CHECK failed: net_param_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_28a,pLVar5);
      }
      if ((local_289 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_288);
      }
      NetParameter::Clear(this->net_param_);
    }
  }
  bVar1 = has_train_state(this);
  if (bVar1) {
    local_2c9 = 0;
    if (this->train_state_ == (NetState *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_2c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x1ba4);
      local_2c9 = 1;
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         (&local_2c8,"CHECK failed: train_state_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_2ca,pLVar5);
    }
    if ((local_2c9 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_2c8);
    }
    NetState::Clear(this->train_state_);
  }
  local_30 = &this->_has_bits_;
  local_34 = 0;
  if ((local_30->has_bits_[0] & 0xfe00) != 0) {
    memset(&this->test_interval_,0,0x1c);
  }
  local_40 = &this->_has_bits_;
  local_44 = 0;
  if ((local_40->has_bits_[0] & 0xff0000) != 0) {
    memset(&this->weight_decay_,0,0x18);
  }
  local_50 = &this->_has_bits_;
  local_54 = 0;
  if ((local_50->has_bits_[0] & 0xff000000) != 0) {
    this->momentum2_ = 0.999;
    this->random_seed_ = -1;
    this->solver_mode_ = 1;
    this->test_initialization_ = true;
    this->snapshot_after_train_ = true;
    this->delta_ = 1e-08;
    this->average_loss_ = 1;
    this->clip_gradients_ = -1.0;
  }
  local_60 = &this->_has_bits_;
  local_64 = 1;
  if (((this->_has_bits_).has_bits_[1] & 7) != 0) {
    this->iter_size_ = 1;
    this->snapshot_format_ = 1;
    this->rms_decay_ = 0.99;
  }
  local_18 = &this->_has_bits_;
  memset(local_18,0,8);
  this_local = (SolverParameter *)&this->_internal_metadata_;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_70 = (InternalMetadataWithArena *)this_local;
    local_10 = (InternalMetadataWithArena *)this_local;
    google::protobuf::internal::InternalMetadataWithArena::DoClear
              ((InternalMetadataWithArena *)this_local);
  }
  return;
}

Assistant:

void SolverParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SolverParameter)
  test_net_.Clear();
  test_iter_.Clear();
  test_net_param_.Clear();
  test_state_.Clear();
  stepvalue_.Clear();
  if (_has_bits_[0 / 32] & 255u) {
    if (has_train_net()) {
      GOOGLE_DCHECK(!train_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*train_net_.UnsafeRawStringPointer())->clear();
    }
    if (has_lr_policy()) {
      GOOGLE_DCHECK(!lr_policy_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*lr_policy_.UnsafeRawStringPointer())->clear();
    }
    if (has_snapshot_prefix()) {
      GOOGLE_DCHECK(!snapshot_prefix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*snapshot_prefix_.UnsafeRawStringPointer())->clear();
    }
    if (has_net()) {
      GOOGLE_DCHECK(!net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*net_.UnsafeRawStringPointer())->clear();
    }
    if (has_regularization_type()) {
      GOOGLE_DCHECK(!regularization_type_.IsDefault(&SolverParameter::_default_regularization_type_.get()));
      (*regularization_type_.UnsafeRawStringPointer())->assign(*&SolverParameter::_default_regularization_type_.get());
    }
    if (has_type()) {
      GOOGLE_DCHECK(!type_.IsDefault(&SolverParameter::_default_type_.get()));
      (*type_.UnsafeRawStringPointer())->assign(*&SolverParameter::_default_type_.get());
    }
    if (has_train_net_param()) {
      GOOGLE_DCHECK(train_net_param_ != NULL);
      train_net_param_->::caffe::NetParameter::Clear();
    }
    if (has_net_param()) {
      GOOGLE_DCHECK(net_param_ != NULL);
      net_param_->::caffe::NetParameter::Clear();
    }
  }
  if (has_train_state()) {
    GOOGLE_DCHECK(train_state_ != NULL);
    train_state_->::caffe::NetState::Clear();
  }
  if (_has_bits_[8 / 32] & 65024u) {
    ::memset(&test_interval_, 0, reinterpret_cast<char*>(&momentum_) -
      reinterpret_cast<char*>(&test_interval_) + sizeof(momentum_));
  }
  if (_has_bits_[16 / 32] & 16711680u) {
    ::memset(&weight_decay_, 0, reinterpret_cast<char*>(&solver_type_) -
      reinterpret_cast<char*>(&weight_decay_) + sizeof(solver_type_));
  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    momentum2_ = 0.999f;
    random_seed_ = GOOGLE_LONGLONG(-1);
    solver_mode_ = 1;
    test_initialization_ = true;
    snapshot_after_train_ = true;
    delta_ = 1e-08f;
    average_loss_ = 1;
    clip_gradients_ = -1;
  }
  if (_has_bits_[32 / 32] & 7u) {
    iter_size_ = 1;
    snapshot_format_ = 1;
    rms_decay_ = 0.99f;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}